

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O1

void duckdb::Node256::DeleteChild(ART *art,Node *node,uint8_t byte)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  ushort uVar4;
  type paVar5;
  long *plVar6;
  pointer this;
  data_ptr_t pdVar7;
  __hash_code __code;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  Node node256;
  IndexPointer local_30;
  
  uVar1 = (node->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar5->_M_elems[5].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar8 = uVar1 & 0xffffffff;
  plVar6 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar8 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar9 = (long *)*plVar6; uVar8 != plVar9[1]; plVar9 = (long *)*plVar9) {
    plVar6 = plVar9;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar6 + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar10 = (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  iVar3 = (_Var2._M_head_impl)->bitmask_offset;
  Node::Free(art,(Node *)(pdVar7 + (ulong)byte * 8 + iVar3 + lVar10 + 8));
  uVar4 = (short)*(undefined4 *)(pdVar7 + iVar3 + lVar10) - 1;
  *(ushort *)(pdVar7 + iVar3 + lVar10) = uVar4;
  if (uVar4 < 0x25) {
    local_30.data = (node->super_IndexPointer).data;
    Node48::ShrinkNode256(art,node,(Node *)&local_30);
  }
  return;
}

Assistant:

void Node256::DeleteChild(ART &art, Node &node, const uint8_t byte) {
	auto &n256 = Node::Ref<Node256>(art, node, NODE_256);

	// Free the child and decrease the count.
	Node::Free(art, n256.children[byte]);
	n256.count--;

	// Shrink to Node48.
	if (n256.count <= SHRINK_THRESHOLD) {
		auto node256 = node;
		Node48::ShrinkNode256(art, node, node256);
	}
}